

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::glyphSpec(GrpParser *this)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  long *in_RDI;
  GrpParser *in_stack_00000030;
  GrpParser *in_stack_00000040;
  ParserException *ex;
  RefAST tmp104_AST;
  RefAST tmp103_AST;
  RefAST tmp102_AST;
  RefAST tmp101_AST;
  RefAST glyphSpec_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffe40;
  BitSet *in_stack_fffffffffffffe48;
  ASTPair *in_stack_fffffffffffffe50;
  RefCount<AST> *in_stack_fffffffffffffe58;
  RefCount<AST> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  ASTFactory *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  ASTPair *in_stack_fffffffffffffe88;
  ASTPair *currentAST_00;
  ASTFactory *in_stack_fffffffffffffe90;
  ASTFactory *this_00;
  RefToken *in_stack_fffffffffffffeb8;
  NoViableAltException *in_stack_fffffffffffffec0;
  undefined1 local_100 [8];
  undefined1 local_f8 [8];
  GrpParser *in_stack_ffffffffffffff10;
  undefined1 local_d8 [23];
  undefined1 local_c1;
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  GrpParser *in_stack_ffffffffffffff50;
  undefined1 local_98 [40];
  GrpParser *in_stack_ffffffffffffff90;
  undefined1 local_48 [56];
  GrpParser *in_stack_fffffffffffffff0;
  
  RefCount<AST>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  ASTPair::ASTPair(in_stack_fffffffffffffe50);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
  uVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  switch(uVar2) {
  case 6:
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    currentAST_00 = (ASTPair *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_98,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe78,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    RefCount<AST>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe50);
    Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if (iVar3 == 6) {
LAB_0020b7ff:
      glyphSpec(in_stack_fffffffffffffff0);
      in_stack_fffffffffffffe78 = (ASTFactory *)(in_RDI + 6);
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
      ASTFactory::addASTChild
                (in_stack_fffffffffffffe90,currentAST_00,
                 (RefAST *)CONCAT44(iVar3,in_stack_fffffffffffffe80));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
      while( true ) {
        in_stack_fffffffffffffe74 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
        bVar1 = BitSet::member(in_stack_fffffffffffffe48,
                               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
        in_stack_fffffffffffffe70 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe70);
        if (!bVar1) break;
        iVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
        if ((iVar4 != 6) && (iVar4 != 0xd)) {
          if (iVar4 == 0x15) {
            RefCount<AST>::RefCount
                      (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
            in_stack_fffffffffffffe60 = (RefCount<AST> *)(in_RDI + 6);
            (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
            ASTFactory::create(in_stack_fffffffffffffe78,
                               (RefToken *)
                               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
            RefCount<AST>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
            RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe50);
            Parser::match((Parser *)CONCAT44(iVar3,in_stack_fffffffffffffe80),
                          (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
            RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
          }
          else if (5 < iVar4 - 0x1aU) {
            local_c1 = 1;
            uVar5 = __cxa_allocate_exception(0x40);
            (**(code **)(*in_RDI + 0x28))(local_c0,in_RDI,1);
            NoViableAltException::NoViableAltException
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            local_c1 = 0;
            __cxa_throw(uVar5,&NoViableAltException::typeinfo,
                        NoViableAltException::~NoViableAltException);
          }
        }
        glyphSpec(in_stack_fffffffffffffff0);
        in_stack_fffffffffffffe50 = (ASTPair *)(in_RDI + 6);
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)in_stack_fffffffffffffe50,
                   (RefCount<AST> *)in_stack_fffffffffffffe48);
        ASTFactory::addASTChild
                  (in_stack_fffffffffffffe90,currentAST_00,
                   (RefAST *)CONCAT44(iVar3,in_stack_fffffffffffffe80));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
      }
    }
    else if (iVar3 != 7) {
      if ((iVar3 != 0xd) && (5 < iVar3 - 0x1aU)) {
        uVar5 = __cxa_allocate_exception(0x40);
        (**(code **)(*in_RDI + 0x28))(local_d8,in_RDI,1);
        NoViableAltException::NoViableAltException
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        __cxa_throw(uVar5,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      goto LAB_0020b7ff;
    }
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe40 = (ASTPair *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_f8,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe78,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    iVar4 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    RefCount<AST>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe50);
    Parser::match((Parser *)CONCAT44(iVar3,in_stack_fffffffffffffe80),iVar4);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    break;
  default:
    uVar5 = __cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_100,in_RDI,1);
    NoViableAltException::NoViableAltException(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    __cxa_throw(uVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  case 0xd:
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe78,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    iVar3 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    RefCount<AST>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe50);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (RefAST *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),iVar3);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    break;
  case 0x1a:
    pseudoFunc(in_stack_00000040);
    this_00 = (ASTFactory *)(in_RDI + 6);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              (this_00,in_stack_fffffffffffffe88,
               (RefAST *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    break;
  case 0x1b:
    unicodeCodepoint(in_stack_ffffffffffffff10);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (RefAST *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    break;
  case 0x1c:
    codepointFunc(in_stack_00000030);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (RefAST *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    break;
  case 0x1d:
    glyphidFunc(in_stack_ffffffffffffff50);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (RefAST *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    break;
  case 0x1e:
    postscriptFunc(in_stack_ffffffffffffff90);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (RefAST *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    break;
  case 0x1f:
    unicodeFunc(in_stack_ffffffffffffff50);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe50->root,(RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (RefAST *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
  }
  RefCount<AST>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  RefCount<AST>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void GrpParser::glyphSpec() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphSpec_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			RefAST tmp101_AST = nullAST;
			tmp101_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp101_AST);
			match(IDENT);
			break;
		}
		case LITERAL_codepoint:
		{
			codepointFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_glyphid:
		{
			glyphidFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_postscript:
		{
			postscriptFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_unicode:
		{
			unicodeFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LIT_UHEX:
		{
			unicodeCodepoint();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_pseudo:
		{
			pseudoFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		{
			{
			RefAST tmp102_AST = nullAST;
			tmp102_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			{
			switch ( LA(1)) {
			case OP_LPAREN:
			case IDENT:
			case LITERAL_pseudo:
			case LIT_UHEX:
			case LITERAL_codepoint:
			case LITERAL_glyphid:
			case LITERAL_postscript:
			case LITERAL_unicode:
			{
				glyphSpec();
				astFactory.addASTChild(currentAST, returnAST);
				{
				do {
					if ((_tokenSet_27.member(LA(1)))) {
						{
						switch ( LA(1)) {
						case OP_COMMA:
						{
							RefAST tmp103_AST = nullAST;
							tmp103_AST = astFactory.create(LT(1));
							match(OP_COMMA);
							break;
						}
						case OP_LPAREN:
						case IDENT:
						case LITERAL_pseudo:
						case LIT_UHEX:
						case LITERAL_codepoint:
						case LITERAL_glyphid:
						case LITERAL_postscript:
						case LITERAL_unicode:
						{
							break;
						}
						default:
						{
							throw NoViableAltException(LT(1));
						}
						}
						}
						glyphSpec();
						astFactory.addASTChild(currentAST, returnAST);
					}
					else {
						goto _loop88;
					}
					
				} while (true);
				_loop88:;
				}
				break;
			}
			case OP_RPAREN:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp104_AST = nullAST;
			tmp104_AST = astFactory.create(LT(1));
			match(OP_RPAREN);
			}
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphSpec_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_28);
	}
	returnAST = glyphSpec_AST;
}